

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_valddi.cpp
# Opt level: O3

ze_result_t
validation_layer::zeCommandListCreate
          (ze_context_handle_t hContext,ze_device_handle_t hDevice,ze_command_list_desc_t *desc,
          ze_command_list_handle_t *phCommandList)

{
  code *pcVar1;
  long lVar2;
  long *plVar3;
  ze_result_t result;
  ze_result_t zVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long *local_68 [2];
  long local_58 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  lVar2 = context;
  lVar6 = *(long *)(context + 0xd50);
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,"zeCommandListCreate(hContext, hDevice, desc, phCommandList)","");
  if (*(char *)(lVar6 + 1) == '\x01') {
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    spdlog::logger::log(*(logger **)(lVar6 + 8),0.0);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  pcVar1 = *(code **)(lVar2 + 0x218);
  if (pcVar1 == (code *)0x0) {
    result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar6 = *(long *)(lVar2 + 0xd30);
    lVar2 = *(long *)(lVar2 + 0xd38);
    lVar5 = lVar2 - lVar6 >> 3;
    if (lVar2 != lVar6) {
      lVar7 = 0;
      do {
        plVar3 = (long *)**(undefined8 **)(*(long *)(context + 0xd30) + lVar7 * 8);
        result = (**(code **)(*plVar3 + 0x230))(plVar3,hContext,hDevice,desc,phCommandList);
        if (result != ZE_RESULT_SUCCESS) goto LAB_0014e068;
        lVar7 = lVar7 + 1;
      } while (lVar5 + (ulong)(lVar5 == 0) != lVar7);
    }
    lVar7 = context;
    if ((*(char *)(context + 4) != '\x01') ||
       (result = ZEHandleLifetimeValidation::zeCommandListCreatePrologue
                           (*(ZEHandleLifetimeValidation **)(context + 0xd48),hContext,hDevice,desc,
                            phCommandList), result == ZE_RESULT_SUCCESS)) {
      zVar4 = (*pcVar1)(hContext,hDevice,desc,phCommandList);
      if (lVar2 != lVar6) {
        lVar6 = 0;
        do {
          plVar3 = (long *)**(undefined8 **)(*(long *)(lVar7 + 0xd30) + lVar6 * 8);
          result = (**(code **)(*plVar3 + 0x238))(plVar3,hContext,hDevice,desc,phCommandList,zVar4);
          if (result != ZE_RESULT_SUCCESS) goto LAB_0014e068;
          lVar6 = lVar6 + 1;
        } while (lVar5 + (ulong)(lVar5 == 0) != lVar6);
      }
      result = zVar4;
      if (((zVar4 == ZE_RESULT_SUCCESS) && (phCommandList != (ze_command_list_handle_t *)0x0)) &&
         (*(char *)(lVar7 + 4) != '\0')) {
        HandleLifetimeValidation::addHandle
                  (*(HandleLifetimeValidation **)(lVar7 + 0xd48),*phCommandList,true);
        HandleLifetimeValidation::addDependent
                  (*(HandleLifetimeValidation **)(lVar7 + 0xd48),hContext,*phCommandList);
      }
    }
  }
LAB_0014e068:
  logAndPropagateResult("zeCommandListCreate",result);
  return result;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeCommandListCreate(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        ze_device_handle_t hDevice,                     ///< [in] handle of the device object
        const ze_command_list_desc_t* desc,             ///< [in] pointer to command list descriptor
        ze_command_list_handle_t* phCommandList         ///< [out] pointer to handle of command list object created
        )
    {
        context.logger->log_trace("zeCommandListCreate(hContext, hDevice, desc, phCommandList)");

        auto pfnCreate = context.zeDdiTable.CommandList.pfnCreate;

        if( nullptr == pfnCreate )
            return logAndPropagateResult("zeCommandListCreate", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeCommandListCreatePrologue( hContext, hDevice, desc, phCommandList );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeCommandListCreate", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zeHandleLifetime.zeCommandListCreatePrologue( hContext, hDevice, desc, phCommandList );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeCommandListCreate", result);
        }

        auto driver_result = pfnCreate( hContext, hDevice, desc, phCommandList );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeCommandListCreateEpilogue( hContext, hDevice, desc, phCommandList ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeCommandListCreate", result);
        }


        if( driver_result == ZE_RESULT_SUCCESS && context.enableHandleLifetime ){
            
            if (phCommandList){
                context.handleLifetime->addHandle( *phCommandList );
                context.handleLifetime->addDependent( hContext, *phCommandList );

            }
        }
        return logAndPropagateResult("zeCommandListCreate", driver_result);
    }